

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BubbleJson.cpp
# Opt level: O1

void __thiscall
bubbleJson::BubbleJson::StringifyValue
          (BubbleJson *this,BubbleValue *value,StringifyTypes stringifyType,int tabCount)

{
  size_t *psVar1;
  ValueTypes VVar2;
  int iVar3;
  undefined1 *puVar4;
  char *pcVar5;
  size_t size;
  void *__dest;
  undefined4 *puVar6;
  
  VVar2 = BubbleValue::GetType(value);
  switch(VVar2) {
  case ValueType_Null:
    puVar6 = (undefined4 *)ContextPush(this,4);
    *puVar6 = 0x6c6c756e;
    break;
  case ValueType_False:
    puVar6 = (undefined4 *)ContextPush(this,5);
    *puVar6 = 0x736c6166;
    *(undefined1 *)(puVar6 + 1) = 0x65;
    break;
  case ValueType_True:
    puVar6 = (undefined4 *)ContextPush(this,4);
    *puVar6 = 0x65757274;
    break;
  case ValueType_Number:
    pcVar5 = (char *)ContextPush(this,0x20);
    BubbleValue::GetNumber(value);
    iVar3 = sprintf(pcVar5,"%.17g");
    psVar1 = &this->context->top;
    *psVar1 = *psVar1 - (long)(0x20 - iVar3);
    break;
  case ValueType_String:
    puVar4 = (undefined1 *)ContextPush(this,1);
    *puVar4 = 0x22;
    pcVar5 = BubbleValue::GetString(value);
    size = BubbleValue::GetStringLength(value);
    __dest = ContextPush(this,size);
    memcpy(__dest,pcVar5,size);
    puVar4 = (undefined1 *)ContextPush(this,1);
    *puVar4 = 0x22;
    break;
  case ValueType_Array:
    StringifyArray(this,value,stringifyType,tabCount);
    return;
  case ValueType_Object:
    StringifyObject(this,value,stringifyType,tabCount);
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/XSAM[P]BubbleJSON/BubbleJSON/BubbleJson.cpp"
                  ,0x1f5,
                  "void bubbleJson::BubbleJson::StringifyValue(BubbleValue *, StringifyTypes, int)")
    ;
  }
  return;
}

Assistant:

void BubbleJson::StringifyValue(BubbleValue *value, StringifyTypes stringifyType, int tabCount)
{
    switch (value->GetType())
    {
        case ValueType_Null:    ContextPushString("null", 4); break;
        case ValueType_True:    ContextPushString("true", 4); break;
        case ValueType_False:   ContextPushString("false", 5); break;
        case ValueType_Number:
            //assume it took 32byte, then reclaim unused memory
            this->context->top -= 32 - sprintf((char*)ContextPush(32), "%.17g", value->GetNumber());
            break;
        case ValueType_String:
            ContextPushChar('\"');
            ContextPushString(value->GetString(), value->GetStringLength());
            ContextPushChar('\"');
            break;
        case ValueType_Object:
            StringifyObject(value, stringifyType, tabCount);
            break;
        case ValueType_Array:
            StringifyArray(value, stringifyType, tabCount);
            break;
        default:
            assert(false);
    }
}